

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

int __thiscall cimg_library::CImgDisplay::close(CImgDisplay *this,int __fd)

{
  Display *pDVar1;
  int iVar2;
  undefined4 in_register_00000034;
  
  if (((this->_width != 0) && (this->_height != 0)) && (this->_is_closed == false)) {
    if (cimg::X11_attr()::val == '\0') {
      iVar2 = __cxa_guard_acquire(&cimg::X11_attr()::val,CONCAT44(in_register_00000034,__fd));
      if (iVar2 != 0) {
        cimg::X11_info::X11_info(&cimg::X11_attr::val);
        __cxa_atexit(cimg::X11_info::~X11_info,&cimg::X11_attr::val,&__dso_handle);
        __cxa_guard_release(&cimg::X11_attr()::val);
      }
    }
    pDVar1 = cimg::X11_attr::val.display;
    XLockDisplay(cimg::X11_attr::val.display);
    if (this->_is_fullscreen == true) {
      _desinit_fullscreen(this);
    }
    XUnmapWindow(pDVar1,this->_window);
    this->_window_y = -1;
    this->_window_x = this->_window_y;
    this->_is_closed = true;
    XUnlockDisplay(pDVar1);
  }
  return (int)this;
}

Assistant:

CImgDisplay& close() {
      if (is_empty() || _is_closed) return *this;
      Display *const dpy = cimg::X11_attr().display;
      XLockDisplay(dpy);
      if (_is_fullscreen) _desinit_fullscreen();
      XUnmapWindow(dpy,_window);
      _window_x = _window_y = -1;
      _is_closed = true;
      XUnlockDisplay(dpy);
      return *this;
    }